

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  SubSections *pSVar1;
  IStreamingReporter *pIVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  int iVar8;
  RunningTest *pRVar9;
  IMutableContext *pIVar10;
  size_t sVar11;
  Totals prevTotals;
  string redirectedCerr;
  string redirectedCout;
  TestCaseInfo testInfo;
  Totals local_2c8;
  string local_2a0;
  string local_280;
  TestCaseInfo local_260;
  TestCaseStats local_180;
  
  local_2c8.assertions.passed = (this->m_totals).assertions.passed;
  local_2c8.assertions.failed = (this->m_totals).assertions.failed;
  local_2c8.testCases.passed = (this->m_totals).testCases.passed;
  local_2c8.testCases.failed = (this->m_totals).testCases.failed;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  local_280._M_string_length = 0;
  local_280.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_260,&testCase->super_TestCaseInfo);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar2,&local_260);
  pRVar9 = (RunningTest *)operator_new(0x70);
  pRVar9->m_info = testCase;
  pRVar9->m_runStatus = RanAtLeastOneSection;
  (pRVar9->m_rootSection).m_state = Root;
  (pRVar9->m_rootSection).m_parent = (RunningSection *)0x0;
  (pRVar9->m_rootSection).m_name._M_dataplus._M_p = (pointer)&(pRVar9->m_rootSection).m_name.field_2
  ;
  pcVar3 = (testCase->super_TestCaseInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pRVar9->m_rootSection).m_name,pcVar3,
             pcVar3 + (testCase->super_TestCaseInfo).name._M_string_length);
  pSVar1 = &(pRVar9->m_rootSection).m_subSections;
  (pSVar1->super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar1->super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar9->m_rootSection).m_subSections.
  super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar9->m_currentSection = &pRVar9->m_rootSection;
  pRVar9->m_changed = false;
  this->m_runningTest = pRVar9;
LAB_00140a46:
  do {
    runCurrentTest(this,&local_280,&local_2a0);
    pRVar9 = this->m_runningTest;
    if ((pRVar9->m_runStatus == RanAtLeastOneSection) ||
       ((bVar7 = RunningSection::hasUntestedSections(&pRVar9->m_rootSection), bVar7 &&
        (pRVar9->m_changed == true)))) {
      sVar4 = (this->m_totals).assertions.failed;
      iVar8 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      if (sVar4 != (long)iVar8) goto LAB_00140a46;
    }
    pIVar10 = getCurrentMutableContext();
    iVar8 = (*(pIVar10->super_IContext)._vptr_IContext[5])(pIVar10);
    if (((char)iVar8 == '\0') ||
       (sVar4 = (this->m_totals).assertions.failed,
       iVar8 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])(),
       sVar4 == (long)iVar8)) {
      Totals::delta(__return_storage_ptr__,&this->m_totals,&local_2c8);
      if (((__return_storage_ptr__->assertions).failed + (__return_storage_ptr__->assertions).passed
           == 0) &&
         (iVar8 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])
                            (), (char)iVar8 != '\0')) {
        sVar4 = (this->m_totals).assertions.passed;
        sVar11 = (this->m_totals).assertions.failed + 1;
        (this->m_totals).assertions.failed = sVar11;
        sVar5 = (this->m_totals).testCases.passed;
        sVar11 = sVar11 - local_2c8.assertions.failed;
        sVar6 = (this->m_totals).testCases.failed;
        (__return_storage_ptr__->assertions).passed = sVar4 - local_2c8.assertions.passed;
        (__return_storage_ptr__->assertions).failed = sVar11;
        (__return_storage_ptr__->testCases).passed =
             (ulong)(sVar11 == 0) + (sVar5 - local_2c8.testCases.passed);
        (__return_storage_ptr__->testCases).failed =
             ((sVar11 != 0) + sVar6) - local_2c8.testCases.failed;
        bVar7 = true;
      }
      else {
        bVar7 = false;
      }
      sVar4 = (__return_storage_ptr__->testCases).failed;
      sVar5 = (this->m_totals).testCases.failed;
      (this->m_totals).testCases.passed =
           (this->m_totals).testCases.passed + (__return_storage_ptr__->testCases).passed;
      (this->m_totals).testCases.failed = sVar5 + sVar4;
      pIVar2 = (this->m_reporter).m_p;
      sVar4 = (this->m_totals).assertions.failed;
      iVar8 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])();
      TestCaseStats::TestCaseStats
                (&local_180,&local_260,__return_storage_ptr__,&local_280,&local_2a0,bVar7,
                 sVar4 == (long)iVar8);
      (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,&local_180);
      TestCaseStats::~TestCaseStats(&local_180);
      pRVar9 = this->m_runningTest;
      if (pRVar9 != (RunningTest *)0x0) {
        RunningSection::~RunningSection(&pRVar9->m_rootSection);
        operator_delete(pRVar9);
      }
      this->m_runningTest = (RunningTest *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.lineInfo.file._M_dataplus._M_p != &local_260.lineInfo.file.field_2) {
        operator_delete(local_260.lineInfo.file._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.tagsAsString._M_dataplus._M_p != &local_260.tagsAsString.field_2) {
        operator_delete(local_260.tagsAsString._M_dataplus._M_p);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_260.tags._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.description._M_dataplus._M_p != &local_260.description.field_2) {
        operator_delete(local_260.description._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.className._M_dataplus._M_p != &local_260.className.field_2) {
        operator_delete(local_260.className._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.name._M_dataplus._M_p != &local_260.name.field_2) {
        operator_delete(local_260.name._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_runningTest = new RunningTest( testCase );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( m_runningTest->hasUntestedSections() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            bool missingAssertions = false;
            if( deltaTotals.assertions.total() == 0  && m_config->warnAboutMissingAssertions() ) {
                m_totals.assertions.failed++;
                deltaTotals = m_totals.delta( prevTotals );
                missingAssertions = true;
            }

            m_totals.testCases += deltaTotals.testCases;

            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        missingAssertions,
                                                        aborting() ) );

            delete m_runningTest;
            m_runningTest = NULL;

            return deltaTotals;
        }